

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O2

void Z80::OpCode_LD(void)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  char cVar6;
  byte bVar7;
  word wVar8;
  Z80Reg ZVar9;
  EBracketType EVar10;
  Z80Reg r16;
  int iVar11;
  Z80Reg ZVar12;
  Z80Reg ZVar13;
  Z80Reg ZVar14;
  ulong uVar15;
  int *piVar16;
  undefined1 signedCheck;
  EType minType;
  aint immediateOffset;
  undefined8 in_RSI;
  byte hiByte;
  EType immediateOffset_00;
  char **in_RDI;
  char **ppcVar17;
  aint b;
  int e [11];
  Z80Reg local_34;
  
  do {
    signedCheck = (undefined1)in_RSI;
    e[8] = -1;
    e[9] = -1;
    e[10] = -1;
    e[4] = -1;
    e[5] = -1;
    e[6] = -1;
    e[7] = -1;
    e[0] = -1;
    e[1] = -1;
    e[2] = -1;
    e[3] = -1;
    bVar4 = true;
    ZVar9 = GetRegister(in_RDI);
    uVar15 = (ulong)(uint)(ZVar9 + Z80_C);
    ZVar13 = ZVar9;
    if ((uint)(ZVar9 + Z80_C) < 0x34) {
      if ((0x80008000007feU >> (uVar15 & 0x3f) & 1) != 0) {
        ZVar14 = Z80_B;
        goto LAB_00131b87;
      }
      if ((0x2000200020000U >> (uVar15 & 0x3f) & 1) != 0) goto LAB_00131b70;
      if (uVar15 != 0) goto LAB_00131b0a;
      ppcVar17 = &lp;
      EVar10 = OpenBracket(&lp);
      if (EVar10 == BT_NONE) goto switchD_00131bc6_caseD_a;
      ZVar13 = GetRegister(ppcVar17);
      if (ZVar13 == Z80_UNK) {
        wVar8 = GetWord(ppcVar17);
        b = (aint)wVar8;
      }
      iVar11 = CloseBracket(&lp);
      if (iVar11 == 0) goto switchD_00131bc6_caseD_a;
      ppcVar17 = &lp;
      bVar4 = comma(&lp);
      if (!bVar4) goto switchD_00131bc6_caseD_a;
      ZVar9 = GetRegister(ppcVar17);
      if (ZVar13 != Z80_UNK) {
        if ((ZVar13 == Z80_DE) || (ZVar13 == Z80_BC)) {
          if (ZVar9 == Z80_A) {
            e[0] = ZVar13 + ~(Z80_I|Z80_L);
          }
        }
        else if (((ZVar13 == Z80_C) && (ZVar9 == Z80_A)) && (Options::IsLR35902 != '\0')) {
          e[0] = 0xe2;
        }
        goto switchD_00131bc6_caseD_a;
      }
      if (Options::IsLR35902 == '\x01') {
        e._4_8_ = CONCAT44(e[2],b) & 0xffffffff000000ff;
        iVar11 = 0xe0;
        if ((b & 0xffffff00U) != 0xff00 || ZVar9 != Z80_A) {
          e._4_8_ = CONCAT44((uint)b >> 8,e[1]) & 0xffffffffff;
          iVar11 = 0xea;
          if (ZVar9 == Z80_SP) {
            iVar11 = 8;
          }
          else if (ZVar9 != Z80_A) goto switchD_00131bc6_caseD_a;
        }
        e[0] = iVar11;
        goto switchD_00131bc6_caseD_a;
      }
      uVar1 = ZVar9 + ~Z80_MEM_HL;
      minType = REGULAR;
      if (uVar1 < 0x3a) {
        if ((0x200000002000200U >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
          if (Options::IsI8080 != '\0') goto switchD_00131bc6_caseD_a;
          e[0] = 0xed;
          iVar11 = ZVar9 + (LR35902_MEM_HL_D|Z80_C);
          goto LAB_0013267b;
        }
        if ((0x20000000001U >> ((ulong)uVar1 & 0x3f) & 1) == 0) goto LAB_0013265d;
        e[0] = (uint)(ZVar9 == Z80_A) << 4 | 0x22;
        e._4_8_ = CONCAT44((uint)b >> 8,b) & 0xff000000ff;
        immediateOffset_00 = minType;
      }
      else {
LAB_0013265d:
        if ((ZVar9 != Z80_IX) && (ZVar9 != Z80_IY)) goto switchD_00131bc6_caseD_a;
        iVar11 = 0x22;
        e[0] = ZVar9;
LAB_0013267b:
        e._4_8_ = CONCAT44(b,iVar11) & 0xffffffffff;
        e[3] = (uint)b >> 8 & 0xff;
        immediateOffset_00 = HIGH;
        minType = REGULAR;
      }
      goto LAB_00131fd3;
    }
LAB_00131b0a:
    if (ZVar9 == Z80_SP) {
LAB_00131b70:
      ZVar14 = Z80_B;
      bVar4 = false;
    }
    else if ((ZVar9 == Z80_IX) || (ZVar9 == Z80_IY)) {
      bVar4 = false;
      ZVar13 = Z80_HL;
      ZVar14 = ZVar9;
    }
    else {
      if ((((ZVar9 != Z80_IXH) && (ZVar9 != Z80_IYH)) && (ZVar9 != Z80_IXL)) &&
         (((ZVar9 != Z80_IYL && (ZVar9 != Z80_MEM_IY)) && (ZVar9 != Z80_MEM_IX))))
      goto switchD_00131bc6_caseD_a;
      ZVar13 = (uint)ZVar9 >> 8;
      ZVar14 = ZVar9 & 0xff;
    }
LAB_00131b87:
    ppcVar17 = &lp;
    bVar3 = comma(&lp);
    pcVar2 = lp;
    lp = pcVar2;
    if (!bVar3) goto switchD_00131bc6_caseD_a;
    local_34 = Z80_B;
    r16 = GetRegister(ppcVar17);
    ZVar12 = r16;
    switch(r16) {
    case Z80_B:
    case Z80_C:
    case Z80_D:
    case Z80_E:
    case Z80_H:
    case Z80_L:
    case Z80_A:
switchD_00131bc6_caseD_0:
      if (bVar4) {
        if ((ZVar13 & ~Z80_BC) != LR35902_MEM_HL_I) goto switchD_00131bc6_caseD_b;
        if (r16 == Z80_A) {
          e[0] = ZVar13;
        }
      }
      break;
    case Z80_MEM_HL:
switchD_00131bc6_caseD_6:
      if (ZVar14 == Z80_B && ZVar13 != Z80_MEM_HL) {
        if (((ZVar13 != Z80_BC) && (ZVar13 != Z80_DE)) &&
           (r16 = Z80_MEM_HL, ZVar13 != Z80_HL || local_34 == Z80_B)) goto switchD_00131bc6_caseD_0;
        goto LAB_00131eb4;
      }
      break;
    case Z80_I:
    case Z80_R:
      if (ZVar13 == Z80_A) {
        e[0] = 0xed;
        iVar11 = (uint)(r16 != Z80_I) * 8 + 0x57;
LAB_00131e7b:
        e[1] = iVar11;
      }
      break;
    case Z80_F:
      break;
    case Z80_F|Z80_C:
    case Z80_I|Z80_H:
    case Z80_I|Z80_L:
    case Z80_I|Z80_MEM_HL:
    case Z80_I|Z80_A:
    case Z80_BC|Z80_C:
    case Z80_BC|Z80_D:
    case Z80_BC|Z80_E:
    case Z80_BC|Z80_H:
    case Z80_BC|Z80_L:
    case Z80_BC|Z80_MEM_HL:
    case Z80_BC|Z80_A:
    case Z80_BC|Z80_I:
    case Z80_BC|Z80_R:
    case Z80_BC|Z80_F:
    case Z80_BC|Z80_F|Z80_C:
    case Z80_BC|Z80_I|Z80_H:
    case Z80_BC|Z80_I|Z80_L:
    case Z80_BC|Z80_I|Z80_MEM_HL:
    case Z80_BC|Z80_I|Z80_A:
    case Z80_DE|Z80_C:
switchD_00131bc6_caseD_b:
      if ((ZVar13 & ~Z80_C) == Z80_I) {
        if (r16 == Z80_A) {
          e[0] = 0xed;
          iVar11 = (uint)(ZVar13 != Z80_I) * 8 + 0x47;
          goto LAB_00131e7b;
        }
      }
      else if (ZVar13 == Z80_SP) {
        if (r16 == Z80_HL) {
          piVar16 = e;
          if (local_34 != Z80_B) {
            e[0] = local_34;
            piVar16 = e + 1;
          }
          *piVar16 = 0xf9;
        }
      }
      else if (bVar4) {
        if (((r16 & ~Z80_C) != Z80_H || (ZVar13 & ~Z80_C) != Z80_H) || ZVar14 == local_34) {
          piVar16 = e;
          if ((local_34 | ZVar14) != Z80_B) {
            if (ZVar13 == Z80_MEM_HL || r16 == Z80_MEM_HL) {
              e[2] = GetRegister_lastIxyD;
            }
            piVar16 = e + 1;
            e[0] = local_34 | ZVar14;
          }
          *piVar16 = r16 + Z80_SP + ZVar13 * 8;
        }
      }
      else {
        bVar4 = Options::noFakes(true);
        if (!bVar4) {
          if (ZVar13 == r16 && ZVar14 != local_34) {
            piVar16 = e;
            if (local_34 != Z80_B) {
              e[0] = local_34;
              piVar16 = e + 1;
            }
            piVar16[0] = 0xe5;
            piVar16[1] = -2;
            if (ZVar14 == Z80_B) {
              piVar16 = piVar16 + 2;
            }
            else {
              piVar16[2] = ZVar14;
              piVar16 = piVar16 + 3;
            }
            *piVar16 = 0xe1;
          }
          else {
            if (local_34 != Z80_B) {
              ZVar14 = local_34;
            }
            piVar16 = e;
            if (ZVar14 != Z80_B) {
              piVar16 = e + 1;
              e[0] = ZVar14;
            }
            ZVar9 = GetRegister_r16High(r16);
            ZVar12 = GetRegister_r16High(ZVar13);
            *piVar16 = ZVar9 + ZVar12 * 8 + 0x40;
            piVar16[1] = -2;
            if (ZVar14 == Z80_B) {
              piVar16 = piVar16 + 2;
            }
            else {
              piVar16[2] = ZVar14;
              piVar16 = piVar16 + 3;
            }
            ZVar9 = GetRegister_r16Low(r16);
            ZVar13 = GetRegister_r16Low(ZVar13);
            *piVar16 = ZVar9 + ZVar13 * 8 + 0x40;
          }
        }
      }
      break;
    case Z80_BC:
    case Z80_DE:
switchD_00131bc6_caseD_10:
      r16 = ZVar12;
      if (!bVar4) goto switchD_00131bc6_caseD_b;
      if (ZVar13 == Z80_MEM_HL) goto LAB_00131eb4;
      break;
    case LR35902_MEM_HL_I:
switchD_00131bc6_caseD_22:
      if (ZVar13 == Z80_A) {
        e[0] = r16 + Z80_I;
      }
      break;
    case Z80_UNK:
LAB_00131eb4:
      lp = pcVar2;
      switch(ZVar9) {
      case Z80_B:
      case Z80_C:
      case Z80_D:
      case Z80_E:
      case Z80_H:
      case Z80_L:
        e[0] = ZVar9 * 8 + 6;
LAB_00131ed3:
        bVar7 = GetByteNoMem((char **)0x0,(bool)signedCheck);
LAB_00131edd:
        e[1] = (uint)bVar7;
        immediateOffset_00 = REGULAR;
        goto LAB_00131ee3;
      case Z80_MEM_HL:
        ZVar13 = GetRegister(ppcVar17);
        if (ZVar13 == Z80_UNK) {
          e[0] = 0x36;
          goto LAB_00131ed3;
        }
        if (((ZVar13 != Z80_DE) && (ZVar13 != Z80_BC)) || (bVar4 = Options::noFakes(true), bVar4))
        break;
        ZVar9 = GetRegister_r16Low(ZVar13);
        e[0] = ZVar9 + (Z80_SP|Z80_HL);
        e[1] = -2;
        e[2] = 0x23;
        e[3] = -2;
        ZVar13 = GetRegister_r16High(ZVar13);
        e[4] = ZVar13 + (Z80_SP|Z80_HL);
LAB_0013222d:
        e[5] = -2;
        e[6] = 0x2b;
        break;
      case Z80_A:
        ppcVar17 = &lp;
        EVar10 = OpenBracket(&lp);
        if (EVar10 != BT_NONE) {
          ZVar13 = GetRegister(ppcVar17);
          if (ZVar13 != Z80_UNK) {
            if (ZVar13 == Z80_C) {
              if ((Options::IsLR35902 == '\x01') && (iVar11 = CloseBracket(&lp), iVar11 != 0)) {
                e[0] = 0xf2;
              }
            }
            else if (((ZVar13 == Z80_DE) || (ZVar13 == Z80_BC)) &&
                    (iVar11 = CloseBracket(&lp), iVar11 != 0)) {
              e[0] = ZVar13 + ~Z80_L;
            }
            break;
          }
          lp = lp + -1;
        }
        iVar11 = ParseExpressionMemAccess(&lp,&b);
        if (iVar11 != 2) {
          if (iVar11 != 1) break;
          check8(b);
          e[0] = 0x3e;
          bVar7 = (byte)b;
          goto LAB_00131edd;
        }
        check16(b);
        if (Options::IsLR35902 == '\x01') {
          if ((b & 0xffffff00U) == 0xff00) {
            e[0] = 0xf0;
            e._4_8_ = CONCAT44(e[2],b) & 0xffffffff000000ff;
            break;
          }
          e[0] = 0xfa;
LAB_00132371:
          e._4_8_ = CONCAT44((uint)b >> 8,b) & 0xff000000ff;
          minType = REGULAR;
          immediateOffset_00 = minType;
          goto LAB_00131fd3;
        }
        e[0] = 0x3a;
        e._4_8_ = CONCAT44((uint)b >> 8,b) & 0xff000000ff;
        resolveRelocationAndSmartSmc(1,REGULAR);
        if (EVar10 != BT_ROUND) break;
        bVar5 = (byte)e[1];
        hiByte = (byte)e[2];
LAB_00132114:
        checkLowMemory(hiByte,bVar5);
        break;
      case Z80_I:
      case Z80_R:
      case Z80_F:
      case Z80_F|Z80_C:
      case Z80_I|Z80_H:
      case Z80_I|Z80_L:
      case Z80_I|Z80_MEM_HL:
      case Z80_I|Z80_A:
        break;
      case Z80_BC:
switchD_00131ec5_caseD_10:
        ZVar13 = GetRegister(ppcVar17);
        if (ZVar13 == Z80_UNK) {
          iVar11 = ParseExpressionMemAccess(&lp,&b);
          if (iVar11 == 2) {
            if (Options::IsLR35902 == '\0') {
              check16(b);
              if (ZVar9 == Z80_HL) {
                e[0] = 0x2a;
                uVar15 = CONCAT44((uint)b >> 8,b) & 0xffffffff000000ff;
                immediateOffset = 1;
              }
              else {
                if (Options::IsI8080 != '\0') break;
                e[0] = 0xed;
                uVar15 = CONCAT44(b,ZVar9 + (Z80_HL|Z80_F|Z80_C));
                e[3] = (uint)b >> 8 & 0xff;
                immediateOffset = 2;
              }
              e._4_8_ = uVar15 & 0xffffffffff;
              resolveRelocationAndSmartSmc(immediateOffset,REGULAR);
              if (lp[-1] == ')') {
                bVar5 = (byte)b;
                hiByte = (byte)((uint)b >> 8);
                goto LAB_00132114;
              }
            }
          }
          else if (iVar11 == 1) {
            check16(b);
            e[0] = ZVar9 + ~(Z80_I|Z80_MEM_HL);
            goto LAB_00132371;
          }
        }
        else if (ZVar13 == Z80_MEM_IY) {
LAB_0013211e:
          if ((ZVar9 != Z80_SP) && (bVar4 = Options::noFakes(true), !bVar4)) {
            e[2] = GetRegister_lastIxyD;
            e[1] = ZVar9 + (Z80_HL|Z80_I|Z80_MEM_HL);
            e[6] = GetRegister_lastIxyD + 1;
            e[5] = ZVar9 + (Z80_HL|Z80_MEM_HL);
            if (GetRegister_lastIxyD == 0x7f) {
              Error("Offset out of range",(char *)0x0,IF_FIRST);
            }
            else {
              e[0] = ZVar13 & 0xff;
              e[4] = e[0];
            }
            e[3] = -2;
          }
        }
        else if (ZVar13 == Z80_SP) {
          if ((ZVar9 == Z80_HL) && (Options::IsLR35902 != '\0')) {
            b = 0;
            iVar11 = SkipBlanks(&lp);
            if (iVar11 == 0) {
              cVar6 = *lp;
              if (cVar6 != '+') {
                if (cVar6 == ',') goto LAB_00132315;
                if (cVar6 != '-') {
                  Error("[LD] `ld hl,sp+r8` expects + or - after sp, found",lp,PASS3);
                  break;
                }
              }
              bVar7 = GetByteNoMem((char **)0x1,SUB81(lp,0));
              b = (aint)bVar7;
            }
LAB_00132315:
            e[0] = 0xf8;
            iVar11 = b;
            goto LAB_00131e7b;
          }
        }
        else {
          if (ZVar13 == Z80_MEM_IX) goto LAB_0013211e;
          if ((ZVar13 == Z80_MEM_HL) && (bVar4 = Options::noFakes(true), !bVar4)) {
            e[0] = ZVar9 + (Z80_HL|Z80_I|Z80_MEM_HL);
            e[1] = -2;
            e[2] = 0x23;
            e[3] = -2;
            e[4] = ZVar9 + (Z80_HL|Z80_MEM_HL);
            goto LAB_0013222d;
          }
        }
        break;
      default:
        if (((uint)(ZVar9 + ~(Z80_BC|Z80_I|Z80_A)) < 0x21) &&
           ((0x100010001U >> ((ulong)(uint)(ZVar9 + ~(Z80_BC|Z80_I|Z80_A)) & 0x3f) & 1) != 0))
        goto switchD_00131ec5_caseD_10;
        if ((ZVar9 == Z80_IX) || (ZVar9 == Z80_IY)) {
          iVar11 = ParseExpressionMemAccess(&lp,&b);
          if (0 < iVar11) {
            e[1] = (uint)(iVar11 != 1) * 9 + 0x21;
            e[0] = ZVar9;
            check16(b);
            e._4_8_ = CONCAT44(b,e[1]) & 0xffffffffff;
            e[3] = (uint)b >> 8 & 0xff;
            resolveRelocationAndSmartSmc(2,REGULAR);
            if ((iVar11 == 2) && (lp[-1] == ')')) {
              bVar5 = (byte)e[2];
              hiByte = (byte)e[3];
              goto LAB_00132114;
            }
          }
          break;
        }
        if ((((ZVar9 == Z80_IXH) || (ZVar9 == Z80_IYH)) || (ZVar9 == Z80_IXL)) || (ZVar9 == Z80_IYL)
           ) {
          e[0] = ZVar9 & 0xff;
          e[1] = ((uint)ZVar9 >> 8) * 8 + 6;
          bVar5 = GetByteNoMem((char **)0x0,(bool)signedCheck);
          e[2]._0_1_ = bVar5;
          e[2]._1_3_ = 0;
          minType = HIGH;
          immediateOffset_00 = minType;
          goto LAB_00131fd3;
        }
        if ((ZVar9 != Z80_MEM_IX) && (ZVar9 != Z80_MEM_IY)) break;
        e[2] = GetRegister_lastIxyD;
        ZVar13 = GetRegister(ppcVar17);
        if (ZVar13 != Z80_UNK) {
          if ((((ZVar13 == Z80_BC) || (ZVar13 == Z80_HL)) || (ZVar13 == Z80_DE)) &&
             (bVar4 = Options::noFakes(true), !bVar4)) {
            if (e[2] == 0x7f) {
              Error("Offset out of range",(char *)0x0,IF_FIRST);
              iVar11 = e[2];
            }
            else {
              e[0] = ZVar9 & 0xff;
              iVar11 = e[2];
            }
            ZVar14 = GetRegister_r16Low(ZVar13);
            e[1] = ZVar14 + (Z80_SP|Z80_HL);
            e[3] = -2;
            e[4] = ZVar9 & 0xff;
            ZVar13 = GetRegister_r16High(ZVar13);
            e[6] = iVar11 + 1;
            e[5] = ZVar13 + (Z80_SP|Z80_HL);
          }
          break;
        }
        e[0] = ZVar9 & 0xff;
        e[1] = 0x36;
        bVar7 = GetByteNoMem((char **)0x0,(bool)signedCheck);
        e[3] = (int)bVar7;
        immediateOffset_00 = HIGH|REGULAR;
LAB_00131ee3:
        minType = HIGH;
LAB_00131fd3:
        resolveRelocationAndSmartSmc(immediateOffset_00,minType);
      }
      break;
    default:
      if (r16 == Z80_HL) {
        if (ZVar13 != Z80_MEM_HL || ZVar14 == Z80_B) {
          r16 = Z80_HL;
          if (bVar4) goto LAB_00131d47;
          goto switchD_00131bc6_caseD_b;
        }
        goto LAB_00131eb4;
      }
      if (r16 == LR35902_MEM_HL_D) goto switchD_00131bc6_caseD_22;
      if (r16 == Z80_SP) {
LAB_00131d47:
        if ((ZVar13 == Z80_HL) && (Options::IsLR35902 != '\0')) goto LAB_00131eb4;
      }
      else if (r16 != Z80_AF) {
        if ((r16 == Z80_IX) || (r16 == Z80_IY)) {
          ZVar12 = Z80_HL;
          local_34 = r16;
          goto switchD_00131bc6_caseD_10;
        }
        if (((r16 != Z80_IXH) && (r16 != Z80_IYH)) && (r16 != Z80_IXL)) {
          if ((r16 == Z80_MEM_IY) || (r16 == Z80_MEM_IX)) {
            local_34 = r16 & 0xff;
            goto switchD_00131bc6_caseD_6;
          }
          if (r16 != Z80_IYL) goto switchD_00131bc6_caseD_b;
        }
        if (!(bool)(bVar4 ^ 1U | ZVar13 == Z80_MEM_HL)) {
          local_34 = r16 & 0xff;
          r16 = (uint)r16 >> 8;
          goto switchD_00131bc6_caseD_b;
        }
      }
    }
switchD_00131bc6_caseD_a:
    in_RSI = 1;
    EmitBytes(e,true);
    in_RDI = &lp;
    cVar6 = (*DAT_0018a520)();
    if (cVar6 == '\0') {
      return;
    }
  } while( true );
}

Assistant:

static void OpCode_LD() {
		aint b;
		EBracketType bt;
		do {
			int e[] { -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1 }, pemaRes;
			Z80Reg reg2 = Z80_UNK, reg1 = GetRegister(lp);
			// resolve all register to register cases or fixed memory literals
			// "(hl)|(ixy+d)|(hl+)|(hl-)" (but not other memory or constant)
			if (Z80_UNK != reg1 && LD_simple_r_r(e, reg1)) {
				EmitBytes(e, true);
				continue;
			}
			// memory, constant, fake instruction or syntax error is involved
			// (!!! comma is already parsed for all destination=register cases)
			switch (reg1) {
			case Z80_A:
				if (BT_NONE != (bt = OpenBracket(lp))) {
					reg2 = GetRegister(lp);
					if ((Z80_BC == reg2 || Z80_DE == reg2) && CloseBracket(lp)) e[0] = reg2-6;
					else if (Z80_C == reg2 && Options::IsLR35902 && CloseBracket(lp)) {
						e[0] = 0xF2;	// Sharp LR35902 `ld a,(c)` (targetting [$ff00+c])
					}
					if (Z80_UNK != reg2) break;	//"(register": emit instruction || bug
					// give non-register another chance to parse as value expression
					--lp;
				}
				switch (ParseExpressionMemAccess(lp, b)) {
					// LD a,imm8
					case 1:
						check8(b); e[0] = 0x06 + 8*reg1; e[1] = b & 255;
						resolveRelocationAndSmartSmc(1, Relocation::HIGH);
						break;
					// LD a,(mem8)
					case 2:
						check16(b);
						if (Options::IsLR35902) {
							if (0xFF00 <= b && b <= 0xFFFF) {
								e[0] = 0xF0; e[1] = b & 255;
							} else {
								e[0] = 0xFA; e[1] = b & 255; e[2] = (b >> 8) & 255;
								resolveRelocationAndSmartSmc(1);
							}
							break;
						}
						e[0] = 0x3a; e[1] = b & 255; e[2] = (b >> 8) & 255;
						resolveRelocationAndSmartSmc(1);
						if (BT_ROUND == bt) checkLowMemory(e[2], e[1]);
						break;
				}
				break;

			case Z80_B: case Z80_C: case Z80_D: case Z80_E: case Z80_H: case Z80_L:
				e[0] = 0x06 + 8*reg1; e[1] = GetByteNoMem(lp);
				resolveRelocationAndSmartSmc(1, Relocation::HIGH);
				break;

			case Z80_MEM_HL:
				switch (reg2 = GetRegister(lp)) {
				case Z80_BC: case Z80_DE:	// fake ld (hl),bc|de
					if (Options::noFakes()) break;
					e[0] = 0x70 + GetRegister_r16Low(reg2);		e[1] = INSTRUCTION_START_MARKER;
					e[2] = 0x23;								e[3] = INSTRUCTION_START_MARKER;
					e[4] = 0x70 + GetRegister_r16High(reg2);	e[5] = INSTRUCTION_START_MARKER;
					e[6] = 0x2b;
					break;
				case Z80_UNK:	// ld (hl),n
					e[0] = 0x36; e[1] = GetByteNoMem(lp);
					resolveRelocationAndSmartSmc(1, Relocation::HIGH);
					break;
				default:
					break;
				}
				break;

			case Z80_MEM_IX: case Z80_MEM_IY:
				e[2] = GetRegister_lastIxyD;
				switch (reg2 = GetRegister(lp)) {
				case Z80_BC: case Z80_DE: case Z80_HL:
					if (Options::noFakes()) break;		//fake LD (ixy+#),r16
					if (e[2] == 127) Error("Offset out of range", nullptr, IF_FIRST);
					else e[0] = reg1&0xFF;
					e[1] = 0x70+GetRegister_r16Low(reg2);
					e[3] = INSTRUCTION_START_MARKER;
					e[4] = reg1&0xFF;
					e[5] = 0x70+GetRegister_r16High(reg2);
					e[6] = e[2] + 1;
					break;
				case Z80_UNK:
					e[0] = reg1&0xFF; e[1] = 0x36; e[3] = GetByteNoMem(lp);	// LD (ixy+#),imm8
					resolveRelocationAndSmartSmc(3, Relocation::HIGH);
					break;
				default:
					break;
				}
				break;

			case Z80_IXH: case Z80_IXL: case Z80_IYH: case Z80_IYL:
				e[0] = reg1&0xFF; e[1] = 0x06 + 8*(reg1>>8); e[2] = GetByteNoMem(lp);
				resolveRelocationAndSmartSmc(2, Relocation::HIGH);
				break;

			case Z80_BC: case Z80_DE: case Z80_HL: case Z80_SP:
				switch (reg2 = GetRegister(lp)) {
				case Z80_MEM_HL:	// invalid combinations filtered already by LD_simple_r_r
					if (Options::noFakes()) break;	// fake ld bc|de,(hl)
					e[0] = reg1+0x3e;
					e[1] = INSTRUCTION_START_MARKER;
					e[2] = 0x23;
					e[3] = INSTRUCTION_START_MARKER;
					e[4] = reg1+0x36;
					e[5] = INSTRUCTION_START_MARKER;
					e[6] = 0x2b;
					break;
				case Z80_MEM_IX: case Z80_MEM_IY:	// invalid combinations NOT filtered -> validate
					if (Z80_SP == reg1 || Options::noFakes()) break;	// fake bc|de|hl,(ix+#)
					e[1] = reg1+0x3e;
					e[5] = reg1+0x36;
					e[2] = GetRegister_lastIxyD;
					e[6] = e[2]+1;
					if (e[2] == 127) Error("Offset out of range", nullptr, IF_FIRST);
					else e[0] = e[4] = reg2&0xFF;
					e[3] = INSTRUCTION_START_MARKER;
					break;
				case Z80_SP:
					if (Options::IsLR35902 && Z80_HL == reg1) {		// "ld hl,sp+r8" syntax = "F8 r8"
						b = 0;
						// "sp" must be followed by + or - (or nothing: "ld hl,sp" = +0)
						if (!SkipBlanks(lp) && ',' != *lp ) {		// comma is probably multi-arg
							if ('+' != *lp && '-' != *lp) {
								Error("[LD] `ld hl,sp+r8` expects + or - after sp, found", lp);
								break;
							}
							b = GetByteNoMem(lp, true);
						}
						e[0] = 0xF8;
						e[1] = b;
					}
					break;
				default:
					break;
				}
				if (Z80_UNK != reg2) break;	//"(register": emit instruction || bug
				switch (ParseExpressionMemAccess(lp, b)) {
					// ld bc|de|hl|sp,imm16
					case 1: check16(b); e[0] = reg1-0x0F; e[1] = b & 255; e[2] = (b >> 8) & 255;
						resolveRelocationAndSmartSmc(1);
						break;
					// LD r16,(mem16)
					case 2:
						if (Options::IsLR35902) break;	// no "ld r16,(a16)" instruction on LR35902
						check16(b);
						if (Z80_HL == reg1) {		// ld hl,(mem16)
							e[0] = 0x2a; e[1] = b & 255; e[2] = (b >> 8) & 255;
							resolveRelocationAndSmartSmc(1);
						} else {					// ld bc|de|sp,(mem16)
							if (Options::IsI8080) break;
							e[0] = 0xed; e[1] = reg1+0x3b; e[2] = b & 255; e[3] = (b >> 8) & 255;
							resolveRelocationAndSmartSmc(2);
						}
						if (')' == lp[-1]) checkLowMemory(b>>8, b);
				}
				break;

			case Z80_IX:
			case Z80_IY:
				if (0 < (pemaRes = ParseExpressionMemAccess(lp, b))) {
					e[0] = reg1; e[1] = (1 == pemaRes) ? 0x21 : 0x2a;	// ld ix|iy,imm16  ||  ld ix|iy,(mem16)
					check16(b); e[2] = b & 255; e[3] = (b >> 8) & 255;
					resolveRelocationAndSmartSmc(2);
					if ((2 == pemaRes) && ')' == lp[-1]) checkLowMemory(e[3], e[2]);
				}
				break;

			case Z80_UNK:
				if (BT_NONE == OpenBracket(lp)) break;
				reg1 = GetRegister(lp);
				if (Z80_UNK == reg1) b = GetWord(lp);
				if (!CloseBracket(lp) || !comma(lp)) break;
				reg2 = GetRegister(lp);
				switch (reg1) {
				case Z80_C:
					if (Options::IsLR35902 && Z80_A == reg2) {	// Sharp LR35902 `ld (c),a` (targetting [$ff00+c])
						e[0] = 0xE2;
					}
					break;
				case Z80_BC:
				case Z80_DE:
					if (Z80_A == reg2) e[0] = reg1-14;	// LD (bc|de),a
					break;
				case Z80_UNK:
					if (Options::IsLR35902) {	// Sharp LR35902 has quite different opcodes for these
						LD_LR35902(e, reg2, b);
						break;
					}
					// Standard Z80 and i8080 opcodes for ld (nn),reg
					switch (reg2) {
					case Z80_A:		// LD (nnnn),a|hl
					case Z80_HL:
						e[0] = (Z80_A == reg2) ? 0x32 : 0x22; e[1] = b & 255; e[2] = (b >> 8) & 255;
						resolveRelocationAndSmartSmc(1);
						break;
					case Z80_BC:	// LD (nnnn),bc|de|sp
					case Z80_DE:
					case Z80_SP:
						if (Options::IsI8080) break;
						e[0] = 0xed; e[1] = 0x33+reg2; e[2] = b & 255; e[3] = (b >> 8) & 255;
						resolveRelocationAndSmartSmc(2);
						break;
					case Z80_IX:	// LD (nnnn),ix|iy
					case Z80_IY:
						e[0] = reg2; e[1] = 0x22; e[2] = b & 255; e[3] = (b >> 8) & 255;
						resolveRelocationAndSmartSmc(2);
						break;
					default:
						break;
					}
					break;
				default:
					break;
				}
				break;
			default:
				break;
			}
			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
	}